

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectGenericLoopSelSwitch<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  long lVar7;
  ulong uVar8;
  idx_t iVar9;
  SelectionVector *pSVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  idx_t iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  idx_t local_78;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar15 = 0;
      }
      else {
        psVar2 = result_sel->sel_vector;
        psVar3 = lsel->sel_vector;
        psVar4 = rsel->sel_vector;
        puVar5 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        puVar6 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        lVar15 = 0;
        uVar14 = 0;
        do {
          uVar13 = uVar14;
          if (psVar2 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar2[uVar14];
          }
          uVar8 = uVar14;
          if (psVar3 != (sel_t *)0x0) {
            uVar8 = (ulong)psVar3[uVar14];
          }
          uVar11 = uVar14;
          if (psVar4 != (sel_t *)0x0) {
            uVar11 = (ulong)psVar4[uVar14];
          }
          if (((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)
              ) && ((puVar6 == (unsigned_long *)0x0 ||
                    ((puVar6[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)))) {
            iVar1 = ldata[uVar8].days;
            iVar17 = rdata[uVar11].days;
            lVar7 = ldata[uVar8].micros;
            lVar12 = rdata[uVar11].micros;
            if (((ldata[uVar8].months == rdata[uVar11].months) && (iVar1 == iVar17)) &&
               (iVar17 = iVar1, lVar7 == lVar12)) goto LAB_00ef32ae;
            lVar18 = (long)iVar1 + lVar7 / 86400000000;
            lVar19 = (long)iVar17 + lVar12 / 86400000000;
            if ((((long)ldata[uVar8].months + lVar18 / 0x1e ==
                  (long)rdata[uVar11].months + lVar19 / 0x1e) && (lVar18 % 0x1e == lVar19 % 0x1e))
               && (lVar7 % 86400000000 == lVar12 % 86400000000)) goto LAB_00ef32ae;
          }
          else {
LAB_00ef32ae:
            false_sel->sel_vector[lVar15] = (sel_t)uVar13;
            lVar15 = lVar15 + 1;
          }
          uVar14 = uVar14 + 1;
        } while (count != uVar14);
      }
      return count - lVar15;
    }
    if (count != 0) {
      psVar2 = result_sel->sel_vector;
      psVar3 = lsel->sel_vector;
      psVar4 = rsel->sel_vector;
      puVar5 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      puVar6 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      local_78 = 0;
      uVar14 = 0;
      do {
        uVar13 = uVar14;
        if (psVar2 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar2[uVar14];
        }
        uVar8 = uVar14;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar14];
        }
        uVar11 = uVar14;
        if (psVar4 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar4[uVar14];
        }
        if (((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0))
           && ((puVar6 == (unsigned_long *)0x0 ||
               ((puVar6[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)))) {
          iVar1 = ldata[uVar8].days;
          iVar17 = rdata[uVar11].days;
          lVar15 = ldata[uVar8].micros;
          lVar7 = rdata[uVar11].micros;
          if (((ldata[uVar8].months != rdata[uVar11].months) || (iVar1 != iVar17)) ||
             (iVar17 = iVar1, lVar15 != lVar7)) {
            lVar12 = (long)iVar1 + lVar15 / 86400000000;
            lVar18 = (long)iVar17 + lVar7 / 86400000000;
            if ((((long)ldata[uVar8].months + lVar12 / 0x1e !=
                  (long)rdata[uVar11].months + lVar18 / 0x1e) || (lVar12 % 0x1e != lVar18 % 0x1e))
               || (lVar15 % 86400000000 != lVar7 % 86400000000)) {
              true_sel->sel_vector[local_78] = (sel_t)uVar13;
              local_78 = local_78 + 1;
            }
          }
        }
        uVar14 = uVar14 + 1;
      } while (count != uVar14);
      return local_78;
    }
  }
  else if (count != 0) {
    psVar2 = result_sel->sel_vector;
    psVar3 = lsel->sel_vector;
    psVar4 = rsel->sel_vector;
    puVar5 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar6 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    local_78 = 0;
    iVar16 = 0;
    uVar14 = 0;
    do {
      uVar13 = uVar14;
      if (psVar2 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar2[uVar14];
      }
      uVar8 = uVar14;
      if (psVar3 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar3[uVar14];
      }
      uVar11 = uVar14;
      if (psVar4 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar4[uVar14];
      }
      if (((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) &&
         ((puVar6 == (unsigned_long *)0x0 || ((puVar6[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0))))
      {
        iVar1 = ldata[uVar8].days;
        iVar17 = rdata[uVar11].days;
        lVar15 = ldata[uVar8].micros;
        lVar7 = rdata[uVar11].micros;
        if (((ldata[uVar8].months == rdata[uVar11].months) && (iVar1 == iVar17)) &&
           (iVar17 = iVar1, lVar15 == lVar7)) goto LAB_00ef2eb5;
        lVar12 = (long)iVar1 + lVar15 / 86400000000;
        lVar18 = (long)iVar17 + lVar7 / 86400000000;
        if ((((long)ldata[uVar8].months + lVar12 / 0x1e ==
              (long)rdata[uVar11].months + lVar18 / 0x1e) && (lVar12 % 0x1e == lVar18 % 0x1e)) &&
           (lVar15 % 86400000000 == lVar7 % 86400000000)) goto LAB_00ef2eb5;
        iVar9 = local_78;
        pSVar10 = true_sel;
        local_78 = local_78 + 1;
      }
      else {
LAB_00ef2eb5:
        iVar9 = iVar16;
        pSVar10 = false_sel;
        iVar16 = iVar16 + 1;
      }
      pSVar10->sel_vector[iVar9] = (sel_t)uVar13;
      uVar14 = uVar14 + 1;
      if (count == uVar14) {
        return local_78;
      }
    } while( true );
  }
  return 0;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}